

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O2

void __thiscall ThreadContext::ValidateThreadContext(ThreadContext *this)

{
  ThreadContext *pTVar1;
  code *pcVar2;
  bool bVar3;
  ThreadContext **ppTVar4;
  undefined4 *puVar5;
  AutoCriticalSection local_18;
  AutoCriticalSection autocs;
  
  local_18.cs = &s_csThreadContext;
  CCLock::Enter(&s_csThreadContext.super_CCLock);
  ppTVar4 = &globalListFirst;
  do {
    pTVar1 = *ppTVar4;
    if (pTVar1 == (ThreadContext *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                         ,0x27b,"(found)","invalid thread context");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
      break;
    }
    ppTVar4 = &(pTVar1->super_DoublyLinkedListElement<ThreadContext,_Memory::ArenaAllocator>).next;
  } while (pTVar1 != this);
  AutoCriticalSection::~AutoCriticalSection(&local_18);
  return;
}

Assistant:

void ThreadContext::ValidateThreadContext()
    {
#if DBG
    // verify the runtime pointer is valid.
        {
            BOOL found = FALSE;
            AutoCriticalSection autocs(ThreadContext::GetCriticalSection());
            ThreadContext* currentThreadContext = GetThreadContextList();
            while (currentThreadContext)
            {
                if (currentThreadContext == this)
                {
                    return;
                }
                currentThreadContext = currentThreadContext->Next();
            }
            AssertMsg(found, "invalid thread context");
        }

#endif
}